

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdCelsiusFlatshadeFirst::emulate_mthd(MthdCelsiusFlatshadeFirst *this)

{
  pgraph_state *state;
  uint val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c & 0x100) !=
      0) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    val = (this->super_SingleMthdTest).super_MthdTest.val & 1 |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
          0xfffffffe;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b = val;
    pgraph_celsius_icmd(state,0x1f,val,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_config_b, 0, 1, val);
				pgraph_celsius_icmd(&exp, 0x1f, exp.bundle_config_b, true);
			}
		}
	}